

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::zmqBrokerServer::mainLoop(zmqBrokerServer *this)

{
  pointer puVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  int iVar5;
  size_type sVar6;
  pointer pfVar7;
  function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
  *pfVar8;
  ostream *poVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar10;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *socket;
  ulong uVar11;
  pointer puVar12;
  long lVar13;
  char *__args;
  long lVar14;
  long lVar15;
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  handleMessage;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  sockets;
  shared_ptr<ZmqContextManager> ctx;
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  data;
  message_t msg;
  
  sockets.
  super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.
  super__Vector_base<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sockets.
  super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sockets.
  super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  handleMessage.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.
  super__Vector_base<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.
  super__Vector_base<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  handleMessage.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  handleMessage.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  msg.msg._._0_8_ = msg.msg._ + 0x10;
  msg.msg._[8] = '\0';
  msg.msg._[9] = '\0';
  msg.msg._[10] = '\0';
  msg.msg._[0xb] = '\0';
  msg.msg._[0xc] = '\0';
  msg.msg._[0xd] = '\0';
  msg.msg._[0xe] = '\0';
  msg.msg._[0xf] = '\0';
  msg.msg._[0x10] = '\0';
  ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  uVar10 = extraout_RDX;
  if (this->zmq_enabled_ == true) {
    loadZMQsocket((zmqBrokerServer *)&poller,(context_t *)this);
    std::
    vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
    ::emplace_back<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>
              ((vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
                *)&sockets,(unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)&poller
              );
    generateServerData((zmqServerData *)&msg,
                       (int)poller.
                            super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 3,2);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::emplace_back<helics::apps::zmqBrokerServer::zmqServerData>(&data,(zmqServerData *)&msg);
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
               *)&msg);
    pfVar3 = handleMessage.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar6 = CLI::std::
              vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
              ::_M_check_len(&handleMessage,1,"vector::_M_realloc_insert");
      pfVar4 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar2 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar7 = CLI::std::
               _Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ::_M_allocate(&handleMessage.
                              super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                             ,sVar6);
      lVar14 = (long)pfVar3 - (long)pfVar2;
      *(undefined8 *)((long)pfVar7 + lVar14 + 8) = 0;
      *(zmqBrokerServer **)((long)pfVar7 + lVar14) = this;
      *(code **)((long)pfVar7 + lVar14 + 0x18) =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_invoke;
      *(code **)((long)pfVar7 + lVar14 + 0x10) =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_manager;
      pfVar8 = std::
               __relocate_a_1<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
                         (pfVar2,pfVar3,pfVar7,
                          (allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                           *)&handleMessage);
      pfVar8 = std::
               __relocate_a_1<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
                         (pfVar3,pfVar4,pfVar8 + 1,
                          (allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                           *)&handleMessage);
      CLI::std::
      _Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ::_M_deallocate(&handleMessage.
                       super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                      ,pfVar2,(long)handleMessage.
                                    super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pfVar2 >> 5);
      handleMessage.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar7 + sVar6;
      handleMessage.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar7;
    }
    else {
      *(undefined8 *)
       ((long)&((handleMessage.
                 super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor + 8)
           = 0;
      *(zmqBrokerServer **)
       &((handleMessage.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = this;
      (handleMessage.
       super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_invoker =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_invoke;
      ((handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_manager =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_manager;
      pfVar8 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    handleMessage.
    super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pfVar8;
    CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::~unique_ptr
              ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)&poller);
    uVar10 = extraout_RDX_00;
  }
  if (this->zmqss_enabled_ == true) {
    loadZMQSSsocket((zmqBrokerServer *)&poller,(context_t *)this);
    std::
    vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
    ::emplace_back<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>
              ((vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
                *)&sockets,(unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)&poller
              );
    generateServerData((zmqServerData *)&msg,
                       (int)poller.
                            super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 4,1);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::emplace_back<helics::apps::zmqBrokerServer::zmqServerData>(&data,(zmqServerData *)&msg);
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
               *)&msg);
    pfVar3 = handleMessage.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar6 = CLI::std::
              vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
              ::_M_check_len(&handleMessage,1,"vector::_M_realloc_insert");
      pfVar4 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar2 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar7 = CLI::std::
               _Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ::_M_allocate(&handleMessage.
                              super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                             ,sVar6);
      lVar14 = (long)pfVar3 - (long)pfVar2;
      *(undefined8 *)((long)pfVar7 + lVar14 + 8) = 0;
      *(zmqBrokerServer **)((long)pfVar7 + lVar14) = this;
      *(code **)((long)pfVar7 + lVar14 + 0x18) =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_invoke;
      *(code **)((long)pfVar7 + lVar14 + 0x10) =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_manager;
      pfVar8 = std::
               __relocate_a_1<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
                         (pfVar2,pfVar3,pfVar7,
                          (allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                           *)&handleMessage);
      pfVar8 = std::
               __relocate_a_1<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>*,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
                         (pfVar3,pfVar4,pfVar8 + 1,
                          (allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                           *)&handleMessage);
      CLI::std::
      _Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ::_M_deallocate(&handleMessage.
                       super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                      ,pfVar2,(long)handleMessage.
                                    super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pfVar2 >> 5);
      handleMessage.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar7 + sVar6;
      handleMessage.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar7;
    }
    else {
      *(undefined8 *)
       ((long)&((handleMessage.
                 super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor + 8)
           = 0;
      *(zmqBrokerServer **)
       &((handleMessage.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = this;
      (handleMessage.
       super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_invoker =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_invoke;
      ((handleMessage.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_manager =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_manager;
      pfVar8 = handleMessage.
               super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    handleMessage.
    super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pfVar8;
    CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::~unique_ptr
              ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)&poller);
    uVar10 = extraout_RDX_01;
  }
  puVar1 = sockets.
           super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (puVar12 = sockets.
                 super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar1; puVar12 = puVar12 + 1
      ) {
    CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::emplace_back<>(&poller);
    poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].socket =
         (((puVar12->_M_t).super___uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>
           ._M_t.super__Tuple_impl<0UL,_zmq::socket_t_*,_std::default_delete<zmq::socket_t>_>.
           super__Head_base<0UL,_zmq::socket_t_*,_false>._M_head_impl)->super_socket_base)._handle;
    poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].events = 1;
    uVar10 = extraout_RDX_02;
  }
  do {
    __args = (char *)0x1388;
    iVar5 = zmq::poll((pollfd *)&poller,5000,(int)uVar10);
    if (iVar5 < 0) {
      __args = "ZMQ broker connection error (2)";
      poVar9 = std::operator<<((ostream *)&std::cerr,"ZMQ broker connection error (2)");
      std::endl<char,std::char_traits<char>>(poVar9);
      puVar12 = sockets.
                super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = sockets.
               super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      break;
    }
    uVar10 = extraout_RDX_03;
    if (iVar5 != 0) {
      zmq::message_t::message_t(&msg);
      lVar15 = 0;
      lVar13 = 0;
      lVar14 = 0xe;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)poller.
                                 super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)poller.
                                 super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar11 = uVar11 + 1) {
        if ((*(byte *)((long)&(poller.
                               super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                               _M_impl.super__Vector_impl_data._M_start)->socket + lVar14) & 1) != 0
           ) {
          __args = (char *)sockets.
                           super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                           super___uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_zmq::socket_t_*,_std::default_delete<zmq::socket_t>_>
                           .super__Head_base<0UL,_zmq::socket_t_*,_false>._M_head_impl;
          CLI::std::
          function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
          ::operator()((function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                        *)((long)&((handleMessage.
                                    super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super__Function_base
                                  )._M_functor + lVar15),(socket_t *)__args,
                       (vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
                        *)((long)&((data.
                                    super__Vector_base<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ports).
                                  super__Vector_base<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13));
        }
        lVar14 = lVar14 + 0x10;
        lVar13 = lVar13 + 0x18;
        lVar15 = lVar15 + 0x20;
      }
      zmq::message_t::~message_t(&msg);
      uVar10 = extraout_RDX_04;
    }
    puVar12 = sockets.
              super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = sockets.
             super__Vector_base<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  } while (((this->exitAll)._M_base._M_i & 1U) == 0);
  for (; puVar12 != puVar1; puVar12 = puVar12 + 1) {
    zmq::socket_t::close
              ((puVar12->_M_t).
               super___uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>._M_t.
               super__Tuple_impl<0UL,_zmq::socket_t_*,_std::default_delete<zmq::socket_t>_>.
               super__Head_base<0UL,_zmq::socket_t_*,_false>._M_head_impl,(int)__args);
  }
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::clear(&sockets);
  CLI::std::_Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~_Vector_base
            (&poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CLI::std::
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ::~vector(&handleMessage);
  CLI::std::
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ::~vector(&data);
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::~vector(&sockets);
  return;
}

Assistant:

void zmqBrokerServer::mainLoop()
{
#ifdef HELICS_ENABLE_ZMQ_CORE
    std::vector<std::unique_ptr<zmq::socket_t>> sockets;
    std::vector<zmqServerData> data;
    std::vector<std::function<void(zmq::socket_t*, portData&)>> handleMessage;

    auto ctx = ZmqContextManager::getContextPointer();

    if (zmq_enabled_) {
        auto sdata = loadZMQsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 3, 2));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg;
            skt->recv(msg);
            std::string response = generateResponseToMessage(msg, pdata, CoreType::ZMQ);
            skt->send(response);
        });
    }

    if (zmqss_enabled_) {
        auto sdata = loadZMQSSsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 4, 1));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg1;
            zmq::message_t msg2;
            skt->recv(msg1);  // should be null
            skt->recv(msg2);
            std::string response = generateResponseToMessage(msg2, pdata, CoreType::ZMQ_SS);
            skt->send(msg1, zmq::send_flags::sndmore);
            skt->send(std::string{}, zmq::send_flags::sndmore);
            skt->send(response, zmq::send_flags::dontwait);
        });
    }

    std::vector<zmq::pollitem_t> poller;
    for (auto& socket : sockets) {
        poller.emplace_back();
        poller.back().socket = static_cast<void*>(*socket);
        poller.back().events = ZMQ_POLLIN;
    }

    int rc = 0;
    while (rc >= 0) {
        try {
            rc = zmq::poll(poller, std::chrono::milliseconds(5000));
        }
        catch (const zmq::error_t& e) {
            logMessage(e.what());
            return;
        }
        if (rc < 0) {
            std::cerr << "ZMQ broker connection error (2)" << std::endl;
            break;
        }
        if (rc > 0) {
            zmq::message_t msg;
            for (std::size_t ii = 0; ii < poller.size(); ++ii) {
                if (zmq::has_message(poller[ii])) {
                    handleMessage[ii](sockets[ii].get(), data[ii].ports);
                }
            }
        }
        if (exitAll.load()) {
            break;
        }
    }

    for (auto& skt : sockets) {
        skt->close();
    }
    sockets.clear();

#endif
}